

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O0

vec4 ImageCodec::decodeFLOAT_FP32Vec<4>(ImageCodec *param_1,void *ptr)

{
  float fVar1;
  float *pfVar2;
  vec<4,_float,_(glm::precision)0> *in_RSI;
  int i;
  float *data;
  vec4 result;
  int local_2c;
  vec<4,_float,_(glm::precision)0> *this;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_10;
  
  this = in_RSI;
  glm::vec<4,_float,_(glm::precision)0>::vec
            ((vec<4,_float,_(glm::precision)0> *)&local_10.field_0,0.0,0.0,0.0,1.0);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    fVar1 = *(float *)((long)&in_RSI->field_0 + (long)local_2c * 4);
    pfVar2 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       (this,(length_type)((ulong)in_RSI >> 0x20));
    *pfVar2 = fVar1;
  }
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)local_10.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_FP32Vec(const ImageCodec*, const void* ptr) {
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const float*>(ptr);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }